

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O2

size_t JlMemoryReadCountValue(void *CountFieldPtr,size_t CountFieldSize)

{
  size_t sVar1;
  
  sVar1 = 0;
  switch(CountFieldSize) {
  case 1:
    return (ulong)*CountFieldPtr;
  case 2:
    return (ulong)*CountFieldPtr;
  case 4:
    return (ulong)*CountFieldPtr;
  case 8:
    sVar1 = *CountFieldPtr;
  }
  return sVar1;
}

Assistant:

size_t
    JlMemoryReadCountValue
    (
        void const*     CountFieldPtr,
        size_t          CountFieldSize
    )
{
    size_t countValue = 0;

    if( sizeof(uint8_t) == CountFieldSize )
    {
        uint8_t const* countElementInStructU8 = (uint8_t*)CountFieldPtr;
        countValue = *countElementInStructU8;
    }
    else if( sizeof(uint16_t) == CountFieldSize )
    {
        uint16_t const* countElementInStructU16 = (uint16_t*)CountFieldPtr;
        countValue = *countElementInStructU16;
    }
    else if( sizeof(uint32_t) == CountFieldSize )
    {
        uint32_t const* countElementInStructU32 = (uint32_t*)CountFieldPtr;
        countValue = *countElementInStructU32;
    }
    else if( sizeof(uint64_t) == CountFieldSize )
    {
        uint64_t const* countElementInStructU64 = (uint64_t*)CountFieldPtr;
        countValue = *countElementInStructU64;
    }
    // else:
    // Invalid size for count field. This should not be possible with the macros, so we don't return an error.
    // Just return a size of 0. If this happens there is some other internal error going on.

    return countValue;
}